

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O3

WebPMuxError MuxGet(WebPMux *mux,CHUNK_INDEX idx,uint32_t nth,WebPData *data)

{
  size_t sVar1;
  WebPChunk *pWVar2;
  uint32_t tag;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  WebPMuxError WVar4;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,nth);
  if (puVar3 != (undefined8 *)0x0) {
    *puVar3 = 0;
    puVar3[1] = 0;
  }
  WVar4 = WEBP_MUX_NOT_FOUND;
  switch(idx) {
  case IDX_VP8X:
    pWVar2 = mux->vp8x;
    tag = 0x58385056;
    break;
  case IDX_ICCP:
    pWVar2 = mux->iccp;
    tag = 0x50434349;
    break;
  case IDX_ANIM:
    pWVar2 = mux->anim;
    tag = 0x4d494e41;
    break;
  default:
    goto switchD_00107232_caseD_3;
  case IDX_EXIF:
    pWVar2 = mux->exif;
    tag = 0x46495845;
    break;
  case IDX_XMP:
    pWVar2 = mux->xmp;
    tag = 0x20504d58;
  }
  pWVar2 = ChunkSearchList(pWVar2,1,tag);
  if (pWVar2 != (WebPChunk *)0x0) {
    sVar1 = (pWVar2->data).size;
    *puVar3 = (pWVar2->data).bytes;
    puVar3[1] = sVar1;
    WVar4 = WEBP_MUX_OK;
  }
switchD_00107232_caseD_3:
  return WVar4;
}

Assistant:

static WebPMuxError MuxGet(const WebPMux* const mux, CHUNK_INDEX idx,
                           uint32_t nth, WebPData* const data) {
  assert(mux != NULL);
  assert(idx != IDX_LAST_CHUNK);
  assert(!IsWPI(kChunks[idx].id));
  WebPDataInit(data);

  SWITCH_ID_LIST(IDX_VP8X, mux->vp8x);
  SWITCH_ID_LIST(IDX_ICCP, mux->iccp);
  SWITCH_ID_LIST(IDX_ANIM, mux->anim);
  SWITCH_ID_LIST(IDX_EXIF, mux->exif);
  SWITCH_ID_LIST(IDX_XMP, mux->xmp);
  assert(idx != IDX_UNKNOWN);
  return WEBP_MUX_NOT_FOUND;
}